

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.test.cpp
# Opt level: O2

void __thiscall npas4_AllocSystem_Test::TestBody(npas4_AllocSystem_Test *this)

{
  long lVar1;
  AssertHelper AVar2;
  char *pcVar3;
  char *in_stack_ffffffffffffffb8;
  AssertHelper local_38;
  int64_t startUsedByCurrentProcess;
  AssertionResult gtest_ar;
  int64_t startTotal;
  
  startTotal = npas4::GetRAMSystemTotal();
  startUsedByCurrentProcess = npas4::GetRAMSystemTotal();
  testing::internal::CmpHelperGT<long,long>
            ((internal *)&gtest_ar,"npas4::GetRAMSystemTotal()","int64_t(1024)",
             &startUsedByCurrentProcess,(long *)&stack0xffffffffffffffc0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&startUsedByCurrentProcess);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
               ,0x38,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc0,(Message *)&startUsedByCurrentProcess);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&startUsedByCurrentProcess);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  startUsedByCurrentProcess = npas4::GetRAMSystemTotal();
  npas4::GetRAMSystemAvailable();
  testing::internal::CmpHelperGT<long,long>
            ((internal *)&gtest_ar,"npas4::GetRAMSystemTotal()","npas4::GetRAMSystemAvailable()",
             &startUsedByCurrentProcess,(long *)&stack0xffffffffffffffc0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&startUsedByCurrentProcess);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
               ,0x39,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc0,(Message *)&startUsedByCurrentProcess);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&startUsedByCurrentProcess);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  startUsedByCurrentProcess = npas4::GetRAMSystemTotal();
  npas4::GetRAMSystemUsed();
  testing::internal::CmpHelperGT<long,long>
            ((internal *)&gtest_ar,"npas4::GetRAMSystemTotal()","npas4::GetRAMSystemUsed()",
             &startUsedByCurrentProcess,(long *)&stack0xffffffffffffffc0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&startUsedByCurrentProcess);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
               ,0x3a,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc0,(Message *)&startUsedByCurrentProcess);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&startUsedByCurrentProcess);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  startUsedByCurrentProcess = npas4::GetRAMSystemAvailable();
  npas4::GetRAMSystemUsed();
  testing::internal::CmpHelperGT<long,long>
            ((internal *)&gtest_ar,"npas4::GetRAMSystemAvailable()","npas4::GetRAMSystemUsed()",
             &startUsedByCurrentProcess,(long *)&stack0xffffffffffffffc0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&startUsedByCurrentProcess);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
               ,0x3b,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffc0,(Message *)&startUsedByCurrentProcess);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&startUsedByCurrentProcess);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  startUsedByCurrentProcess = npas4::GetRAMSystemUsedByCurrentProcess();
  npas4::GetRAMSystemTotal();
  local_38.data_ = (AssertHelperData *)npas4::GetRAMSystemUsedByCurrentProcess();
  testing::internal::CmpHelperGT<long,long>
            ((internal *)&gtest_ar,"npas4::GetRAMSystemTotal()",
             "npas4::GetRAMSystemUsedByCurrentProcess()",(long *)&stack0xffffffffffffffc0,
             (long *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
               ,0x3e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&stack0xffffffffffffffc0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  npas4::GetRAMSystemAvailable();
  local_38.data_ = (AssertHelperData *)npas4::GetRAMSystemUsedByCurrentProcess();
  testing::internal::CmpHelperGT<long,long>
            ((internal *)&gtest_ar,"npas4::GetRAMSystemAvailable()",
             "npas4::GetRAMSystemUsedByCurrentProcess()",(long *)&stack0xffffffffffffffc0,
             (long *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
               ,0x3f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&stack0xffffffffffffffc0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  npas4::GetRAMSystemUsed();
  local_38.data_ = (AssertHelperData *)npas4::GetRAMSystemUsedByCurrentProcess();
  testing::internal::CmpHelperGT<long,long>
            ((internal *)&gtest_ar,"npas4::GetRAMSystemUsed()",
             "npas4::GetRAMSystemUsedByCurrentProcess()",(long *)&stack0xffffffffffffffc0,
             (long *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
               ,0x40,pcVar3);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&stack0xffffffffffffffc0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  lVar1 = std::chrono::_V2::system_clock::now();
  if (lVar1 == 0) {
    npas4::GetRAMSystemTotal();
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)&gtest_ar,"startTotal","npas4::GetRAMSystemTotal()",&startTotal,
               (long *)&stack0xffffffffffffffc0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&stack0xffffffffffffffc0);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
                 ,0x49,pcVar3);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffffc0);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    AVar2.data_ = (AssertHelperData *)npas4::GetRAMSystemUsedByCurrentProcess();
    testing::internal::CmpHelperNE<long,long>
              ((internal *)&gtest_ar,"startUsedByCurrentProcess",
               "npas4::GetRAMSystemUsedByCurrentProcess()",&startUsedByCurrentProcess,
               (long *)&stack0xffffffffffffffc0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&stack0xffffffffffffffc0);
      std::operator<<((ostream *)&(AVar2.data_)->line,
                      "We did an allocation, but are using exactly the same amount of RAM.");
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
                 ,0x4a,pcVar3);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffffc0);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    AVar2.data_ = (AssertHelperData *)
                  ((long)DWORD_ARRAY_00100fac + startUsedByCurrentProcess + 0x54);
    local_38.data_ = (AssertHelperData *)npas4::GetRAMSystemUsedByCurrentProcess();
    testing::internal::CmpHelperLT<long,long>
              ((internal *)&gtest_ar,"startUsedByCurrentProcess + allocAmmount",
               "npas4::GetRAMSystemUsedByCurrentProcess()",(long *)&stack0xffffffffffffffc0,
               (long *)&local_38);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&stack0xffffffffffffffc0);
      std::operator<<((ostream *)&(AVar2.data_)->line,
                      "We did an allocation, but are using less RAM. Start: ");
      std::ostream::_M_insert<long>((long)&(AVar2.data_)->line);
      std::operator<<((ostream *)&(AVar2.data_)->line,", Alloc: ");
      std::ostream::_M_insert<long>((long)&(AVar2.data_)->line);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
                 ,0x4c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffffc0);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    AVar2.data_ = (AssertHelperData *)npas4::GetRAMSystemUsedByCurrentProcess();
    testing::internal::CmpHelperGT<long,long>
              ((internal *)&gtest_ar,"npas4::GetRAMSystemUsedByCurrentProcess()",
               "startUsedByCurrentProcess",(long *)&stack0xffffffffffffffc0,
               &startUsedByCurrentProcess);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&stack0xffffffffffffffc0);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
                 ,0x50,pcVar3);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffffc0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      npas4::GetRAMSystemUsedByCurrentProcess();
      npas4::GetRAMSystemUsedByCurrentProcess();
      testing::internal::DoubleNearPredFormat
                ((char *)AVar2.data_,in_stack_ffffffffffffffb8,(char *)0x11edd3,
                 (double)gtest_ar.message_.ptr_,(double)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
                 (double)startUsedByCurrentProcess);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&stack0xffffffffffffffc0);
        std::operator<<((ostream *)&(AVar2.data_)->line,"Memory Delta: ");
        std::ostream::_M_insert<long>((long)&(AVar2.data_)->line);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/DigitalInBlue[P]Npas4/test/npas4/Npas4.test.cpp"
                   ,0x53,pcVar3);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&stack0xffffffffffffffc0);
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  return;
}

Assistant:

TEST(npas4, AllocSystem)
{
	const auto startTotal = npas4::GetRAMSystemTotal();
	EXPECT_GT(npas4::GetRAMSystemTotal(), int64_t(1024));
	EXPECT_GT(npas4::GetRAMSystemTotal(), npas4::GetRAMSystemAvailable());
	EXPECT_GT(npas4::GetRAMSystemTotal(), npas4::GetRAMSystemUsed());
	EXPECT_GT(npas4::GetRAMSystemAvailable(), npas4::GetRAMSystemUsed());

	const auto startUsedByCurrentProcess = npas4::GetRAMSystemUsedByCurrentProcess();
	EXPECT_GT(npas4::GetRAMSystemTotal(), npas4::GetRAMSystemUsedByCurrentProcess());
	EXPECT_GT(npas4::GetRAMSystemAvailable(), npas4::GetRAMSystemUsedByCurrentProcess());
	EXPECT_GT(npas4::GetRAMSystemUsed(), npas4::GetRAMSystemUsedByCurrentProcess());

	// This will always be true, but the compiler won't know that, preventing the
	// allocation from happening before we want it to.
	if(std::chrono::system_clock::now() == std::chrono::time_point<std::chrono::system_clock>())
	{
		const int64_t allocAmmount = 1052672;
		volatile uint8_t* megabyte = new uint8_t[allocAmmount];

		EXPECT_EQ(startTotal, npas4::GetRAMSystemTotal());
		EXPECT_NE(startUsedByCurrentProcess, npas4::GetRAMSystemUsedByCurrentProcess()) << "We did an allocation, but are using exactly the same amount of RAM.";

		EXPECT_LT(startUsedByCurrentProcess + allocAmmount, npas4::GetRAMSystemUsedByCurrentProcess())
			<< "We did an allocation, but are using less RAM. Start: " << startUsedByCurrentProcess << ", Alloc: " << allocAmmount;

		// Assume we are not swapping out to disk
		ASSERT_GT(npas4::GetRAMSystemUsedByCurrentProcess(), startUsedByCurrentProcess);

		const auto memoryDelta = npas4::GetRAMSystemUsedByCurrentProcess() - startUsedByCurrentProcess;
		EXPECT_NEAR(npas4::GetRAMSystemUsedByCurrentProcess() - startUsedByCurrentProcess, memoryDelta, 4096) << "Memory Delta: " << memoryDelta;

		delete[] megabyte;
	}
}